

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_utils.cpp
# Opt level: O0

Subject * bidfx_public_api::price::subject::SubjectUtils::CreateSubjectFromString
                    (Subject *__return_storage_ptr__,string *formatted_subject)

{
  SubjectFormatter local_60;
  undefined1 local_30 [8];
  SubjectBuilder builder;
  string *formatted_subject_local;
  
  builder.components_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = formatted_subject;
  SubjectBuilder::SubjectBuilder((SubjectBuilder *)local_30);
  SubjectFormatter::SubjectFormatter(&local_60);
  SubjectFormatter::ParseSubject
            (&local_60,
             builder.components_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(SubjectBuilder *)local_30);
  SubjectFormatter::~SubjectFormatter(&local_60);
  SubjectBuilder::CreateSubject(__return_storage_ptr__,(SubjectBuilder *)local_30);
  SubjectBuilder::~SubjectBuilder((SubjectBuilder *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Subject SubjectUtils::CreateSubjectFromString(const std::string& formatted_subject)
{
    SubjectBuilder builder = SubjectBuilder();
    SubjectFormatter().ParseSubject(formatted_subject, builder);
    return builder.CreateSubject();
}